

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *complexity)

{
  REF_NODE ref_node_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG ntet;
  REF_INT local_a8;
  REF_BOOL have_vol_cells;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *complexity_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_node_00 = ref_grid->node;
  *complexity = 0.0;
  metric_local._4_4_ = ref_cell_ncell(ref_grid->cell[8],ref_node_00,&npyr);
  if (metric_local._4_4_ == 0) {
    metric_local._4_4_ = ref_cell_ncell(ref_grid->cell[9],ref_node_00,&npri);
    if (metric_local._4_4_ == 0) {
      metric_local._4_4_ = ref_cell_ncell(ref_grid->cell[10],ref_node_00,&nhex);
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ =
             ref_cell_ncell(ref_grid->cell[0xb],ref_node_00,
                            (REF_LONG *)&ref_private_macro_code_rss_1);
        if (metric_local._4_4_ == 0) {
          ntet._4_4_ = (uint)(0 < npyr + npri + nhex + _ref_private_macro_code_rss_1);
          if (ntet._4_4_ == 0) {
            unique0x00012000 = ref_grid->cell[3];
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&local_a8);
              if ((RVar1 == 0) &&
                 (uVar2 = ref_metric_sub_tri_complexity
                                    (0,1,2,&local_a8,metric,complexity,ref_node_00), uVar2 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x7a6,"ref_metric_complexity",(ulong)uVar2,"tri sub_tri");
                return uVar2;
              }
            }
            unique0x00012000 = ref_grid->cell[6];
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&local_a8);
              if ((RVar1 == 0) &&
                 (uVar2 = ref_metric_sub_tri_complexity
                                    (0,1,2,&local_a8,metric,complexity,ref_node_00), uVar2 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x7ad,"ref_metric_complexity",(ulong)uVar2,"qua sub_tri");
                return uVar2;
              }
            }
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&local_a8);
              if ((RVar1 == 0) &&
                 (uVar2 = ref_metric_sub_tri_complexity
                                    (0,2,3,&local_a8,metric,complexity,ref_node_00), uVar2 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x7b2,"ref_metric_complexity",(ulong)uVar2,"qua sub_tri");
                return uVar2;
              }
            }
          }
          else {
            unique0x00012000 = ref_grid->cell[8];
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&local_a8);
              if ((RVar1 == 0) &&
                 (uVar2 = ref_metric_sub_tet_complexity
                                    (0,1,2,3,&local_a8,metric,complexity,ref_node_00), uVar2 != 0))
              {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x772,"ref_metric_complexity",(ulong)uVar2,"tet sub_tet");
                return uVar2;
              }
            }
            unique0x00012000 = ref_grid->cell[9];
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&local_a8);
              if (RVar1 == 0) {
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,4,1,2,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x779,"ref_metric_complexity",(ulong)uVar2,"pyr sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,3,4,2,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x77c,"ref_metric_complexity",(ulong)uVar2,"pyr sub_tet");
                  return uVar2;
                }
              }
            }
            unique0x00012000 = ref_grid->cell[10];
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&local_a8);
              if (RVar1 == 0) {
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,4,5,3,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x783,"ref_metric_complexity",(ulong)uVar2,"pri sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,1,5,4,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x786,"ref_metric_complexity",(ulong)uVar2,"pri sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,1,2,5,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x789,"ref_metric_complexity",(ulong)uVar2,"pri sub_tet");
                  return uVar2;
                }
              }
            }
            unique0x00012000 = ref_grid->cell[0xb];
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&local_a8);
              if (RVar1 == 0) {
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,5,7,4,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x790,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,1,7,5,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x793,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (1,6,7,5,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x796,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,7,2,3,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x799,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (0,7,1,2,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x79c,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
                  return uVar2;
                }
                uVar2 = ref_metric_sub_tet_complexity
                                  (1,7,6,2,&local_a8,metric,complexity,ref_node_00);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x79f,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
                  return uVar2;
                }
              }
            }
          }
          metric_local._4_4_ = ref_mpi_allsum(ref_grid->mpi,complexity,1,3);
          if (metric_local._4_4_ == 0) {
            metric_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x7b7,"ref_metric_complexity",(ulong)metric_local._4_4_,"dbl sum");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x76b,"ref_metric_complexity",(ulong)metric_local._4_4_,"count");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x76a,"ref_metric_complexity",(ulong)metric_local._4_4_,"count");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x769,"ref_metric_complexity",(ulong)metric_local._4_4_,"count");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x768,
           "ref_metric_complexity",(ulong)metric_local._4_4_,"count");
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_complexity(REF_DBL *metric, REF_GRID ref_grid,
                                         REF_DBL *complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL have_vol_cells;
  REF_LONG ntet, npyr, npri, nhex;
  *complexity = 0.0;
  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "count");
  RSS(ref_cell_ncell(ref_grid_pyr(ref_grid), ref_node, &npyr), "count");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "count");
  RSS(ref_cell_ncell(ref_grid_hex(ref_grid), ref_node, &nhex), "count");
  have_vol_cells = (0 < ntet + npyr + npri + nhex);
  if (have_vol_cells) {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 1, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "tet sub_tet");
    }

    ref_cell = ref_grid_pyr(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 4, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "pyr sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 3, 4, 2, nodes, metric, complexity,
                                        ref_node),
          "pyr sub_tet");
    }

    ref_cell = ref_grid_pri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 4, 5, 3, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 5, 4, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 2, 5, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
    }

    ref_cell = ref_grid_hex(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 5, 7, 4, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 7, 5, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(1, 6, 7, 5, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 7, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 7, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(1, 7, 6, 2, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
    }
  } else {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "tri sub_tri");
    }

    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "qua sub_tri");
    }
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "qua sub_tri");
    }
  }

  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), complexity, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}